

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlNodeSetPtr xmlXPathPopNodeSet(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlNodeSetPtr pxVar2;
  long lVar3;
  xmlXPathObjectPtr pxVar4;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (ctxt->value == (xmlXPathObjectPtr)0x0) {
      xmlXPathErr(ctxt,10);
      ctxt->error = 10;
    }
    else {
      if ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE) {
        iVar1 = ctxt->valueNr;
        lVar3 = (long)iVar1;
        if (lVar3 < 1) {
          pxVar4 = (xmlXPathObjectPtr)0x0;
        }
        else {
          ctxt->valueNr = iVar1 + -1;
          if (iVar1 == 1) {
            pxVar4 = (xmlXPathObjectPtr)0x0;
          }
          else {
            pxVar4 = ctxt->valueTab[lVar3 + -2];
          }
          ctxt->value = pxVar4;
          pxVar4 = ctxt->valueTab[lVar3 + -1];
          ctxt->valueTab[lVar3 + -1] = (xmlXPathObjectPtr)0x0;
        }
        pxVar2 = pxVar4->nodesetval;
        pxVar4->nodesetval = (xmlNodeSetPtr)0x0;
        xmlXPathReleaseObject(ctxt->context,pxVar4);
        return pxVar2;
      }
      xmlXPathErr(ctxt,0xb);
      ctxt->error = 0xb;
    }
  }
  return (xmlNodeSetPtr)0x0;
}

Assistant:

xmlNodeSetPtr
xmlXPathPopNodeSet (xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr obj;
    xmlNodeSetPtr ret;

    if (ctxt == NULL) return(NULL);
    if (ctxt->value == NULL) {
	xmlXPathSetError(ctxt, XPATH_INVALID_OPERAND);
	return(NULL);
    }
    if (!xmlXPathStackIsNodeSet(ctxt)) {
	xmlXPathSetTypeError(ctxt);
	return(NULL);
    }
    obj = xmlXPathValuePop(ctxt);
    ret = obj->nodesetval;
    obj->nodesetval = NULL;
    xmlXPathReleaseObject(ctxt->context, obj);
    return(ret);
}